

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall
GraphPropagator::GraphPropagator
          (GraphPropagator *this,vec<BoolView> *_vs,vec<BoolView> *_es,vec<vec<int>_> *_en)

{
  uint uVar1;
  vec<int> *pvVar2;
  vec<vec<int>_> *in_RCX;
  undefined8 *in_RDI;
  uint j;
  uint i;
  Propagator *in_stack_ffffffffffffff10;
  vec<BoolView> *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  uint uVar3;
  size_type in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  uint local_74;
  uint local_70;
  
  Propagator::Propagator(in_stack_ffffffffffffff10);
  *in_RDI = &PTR__GraphPropagator_0031f990;
  vec<BoolView>::vec<BoolView>
            ((vec<BoolView> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
  vec<BoolView>::vec<BoolView>
            ((vec<BoolView> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x2a8920);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x2a8933);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x2a8946);
  vec<vec<int>_>::size(in_RCX);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2a898d);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2a899f);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
           in_stack_ffffffffffffff28,
           (value_type *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
           (allocator_type *)in_stack_ffffffffffffff18);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_ffffffffffffff18);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x2a89ed);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  local_70 = 0;
  while( true ) {
    uVar3 = local_70;
    uVar1 = vec<vec<int>_>::size(in_RCX);
    if (uVar1 <= uVar3) break;
    local_74 = 0;
    while( true ) {
      uVar3 = local_74;
      pvVar2 = vec<vec<int>_>::operator[](in_RCX,local_70);
      uVar1 = vec<int>::size(pvVar2);
      if (uVar1 <= uVar3) break;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RDI + 10),(ulong)local_70);
      pvVar2 = vec<vec<int>_>::operator[](in_RCX,local_70);
      vec<int>::operator[](pvVar2,local_74);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar3,uVar1),
                 (value_type_conflict *)pvVar2);
      local_74 = local_74 + 1;
    }
    local_70 = local_70 + 1;
  }
  *(undefined4 *)((long)in_RDI + 0xc) = 1;
  return;
}

Assistant:

GraphPropagator::GraphPropagator(vec<BoolView>& _vs, vec<BoolView>& _es, vec<vec<int> >& _en)
		: vs(_vs), es(_es) {
	endnodes = std::vector<std::vector<int> >(_en.size(), std::vector<int>());
	for (unsigned int i = 0; i < _en.size(); i++) {
		for (unsigned int j = 0; j < _en[i].size(); j++) {  // when directed:
			endnodes[i].push_back(_en[i][j]);                 //[0] ---> [1]
		}
	}
	if (DEBUG) {
		for (int i = 0; i < nbEdges(); i++) {
			std::cout << i << " " << _en[i][0] << " " << _en[i][1] << '\n';
		}
	}

	priority = 1;
}